

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

void ma_pcm_s24_to_u8(void *dst,void *src,ma_uint64 count,ma_dither_mode ditherMode)

{
  ma_uint64 mVar1;
  char cVar2;
  byte *pbVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  ma_lcg mVar7;
  uint uVar8;
  
  if (ditherMode == ma_dither_mode_none) {
    if (count != 0) {
      pcVar4 = (char *)((long)src + 2);
      mVar1 = 0;
      do {
        *(char *)((long)dst + mVar1) = *pcVar4 + -0x80;
        mVar1 = mVar1 + 1;
        pcVar4 = pcVar4 + 3;
      } while (count != mVar1);
    }
  }
  else if (count != 0) {
    pbVar3 = (byte *)((long)src + 2);
    mVar1 = 0;
    mVar7.state = g_maLCG.state;
    do {
      if (ditherMode == ma_dither_mode_triangle) {
        iVar5 = mVar7.state * 0xbc8f;
        uVar8 = iVar5 + ((int)((long)iVar5 * 0x40000001 >> 0x3d) - (iVar5 >> 0x1f)) * -0x7fffffff;
        iVar5 = uVar8 * 0xbc8f;
        iVar6 = (int)((long)iVar5 * 0x40000001 >> 0x3d) - (iVar5 >> 0x1f);
        mVar7.state = iVar6 * -0x80000000 + iVar5 + iVar6;
        iVar5 = (uVar8 >> 9) + ((uint)mVar7.state >> 9) + -0x800000;
        g_maLCG.state = mVar7.state;
      }
      else if (ditherMode == ma_dither_mode_rectangle) {
        iVar5 = mVar7.state * 0xbc8f;
        iVar6 = (int)((long)iVar5 * 0x40000001 >> 0x3d) - (iVar5 >> 0x1f);
        mVar7.state = iVar6 * -0x80000000 + iVar5 + iVar6;
        iVar5 = ((uint)mVar7.state >> 8) - 0x800000;
        g_maLCG.state = mVar7.state;
      }
      else {
        iVar5 = 0;
      }
      uVar8 = (uint)*pbVar3 << 0x18 | (uint)pbVar3[-1] << 0x10 | (uint)pbVar3[-2] << 8;
      cVar2 = (char)(iVar5 + uVar8 >> 0x18) + -0x80;
      if (0x7fffffff < (long)iVar5 + (long)(int)uVar8) {
        cVar2 = -1;
      }
      *(char *)((long)dst + mVar1) = cVar2;
      mVar1 = mVar1 + 1;
      pbVar3 = pbVar3 + 3;
    } while (count != mVar1);
  }
  return;
}

Assistant:

static MA_INLINE void ma_pcm_s24_to_u8__reference(void* dst, const void* src, ma_uint64 count, ma_dither_mode ditherMode)
{
    ma_uint8* dst_u8 = (ma_uint8*)dst;
    const ma_uint8* src_s24 = (const ma_uint8*)src;

    if (ditherMode == ma_dither_mode_none) {
        ma_uint64 i;
        for (i = 0; i < count; i += 1) {
            ma_int8 x = (ma_int8)src_s24[i*3 + 2] + 128;
            dst_u8[i] = (ma_uint8)x;
        }
    } else {
        ma_uint64 i;
        for (i = 0; i < count; i += 1) {
            ma_int32 x = (ma_int32)(((ma_uint32)(src_s24[i*3+0]) << 8) | ((ma_uint32)(src_s24[i*3+1]) << 16) | ((ma_uint32)(src_s24[i*3+2])) << 24);

            /* Dither. Don't overflow. */
            ma_int32 dither = ma_dither_s32(ditherMode, -0x800000, 0x7FFFFF);
            if ((ma_int64)x + dither <= 0x7FFFFFFF) {
                x = x + dither;
            } else {
                x = 0x7FFFFFFF;
            }
            
            x = x >> 24;
            x = x + 128;
            dst_u8[i] = (ma_uint8)x;
        }
    }
}